

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

iterator * __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::prior
          (iterator *this)

{
  bool bVar1;
  node_type nVar2;
  bool local_39;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 aStack_38;
  bool match;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 *local_30;
  art_key_type *akey;
  basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *leaf;
  olc_node_ptr node;
  iterator *this_local;
  
  node.tagged_ptr = (uintptr_t)this;
  leaf = (basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)current_node(this);
  bVar1 = detail::basic_node_ptr<unodb::detail::olc_node_header>::operator==
                    ((basic_node_ptr<unodb::detail::olc_node_header> *)&leaf,(nullptr_t)0x0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    nVar2 = detail::basic_node_ptr<unodb::detail::olc_node_header>::type
                      ((basic_node_ptr<unodb::detail::olc_node_header> *)&leaf);
    if (nVar2 != LEAF) {
      __assert_fail("node.type() == node_type::LEAF",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                    ,0x88c,
                    "typename olc_db<Key, Value>::iterator &unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::prior() [Key = unsigned long, Value = std::span<const std::byte>]"
                   );
    }
    akey = (art_key_type *)
           detail::basic_node_ptr<unodb::detail::olc_node_header>::
           ptr<unodb::detail::basic_leaf<unsigned_long,unodb::detail::olc_node_header>*>
                     ((basic_node_ptr<unodb::detail::olc_node_header> *)&leaf);
    aStack_38.key_bytes._M_elems =
         (array<std::byte,_8UL>)
         detail::basic_leaf<unsigned_long,_unodb::detail::olc_node_header>::get_key
                   ((basic_leaf<unsigned_long,_unodb::detail::olc_node_header> *)akey);
    local_30 = &stack0xffffffffffffffc8;
    bVar1 = try_prior(this);
    while (!bVar1) {
      do {
        local_39 = false;
        bVar1 = try_seek(this,(art_key_type)*&(local_30->key_bytes)._M_elems,&local_39,false);
      } while (!bVar1);
      if ((local_39 & 1U) == 0) {
        return this;
      }
      bVar1 = try_prior(this);
    }
  }
  return this;
}

Assistant:

typename olc_db<Key, Value>::iterator& olc_db<Key, Value>::iterator::prior() {
  const auto node = current_node();
  if (node != nullptr) {
    UNODB_DETAIL_ASSERT(node.type() == node_type::LEAF);      // On a leaf.
    const auto* const leaf{node.template ptr<leaf_type*>()};  // current leaf
    // TODO(thompsonbry) : variable length keys: We need a temporary
    // copy of the key since actions on the stack will make it
    // impossible to reconstruct the key.  So maybe we have two
    // internal buffers on the iterator to support this?
    const auto& akey = leaf->get_key();  // access the key on the leaf.
    if (UNODB_DETAIL_LIKELY(try_prior())) return *this;
    while (true) {
      bool match{};
      // seek to the current key (or its predecessor)
      if (!try_seek(akey, match, false /*fwd*/)) continue;
      if (!match) {
        // The key no longer exists, so its predecessor is the prior
        // leaf and we are done.
        return *this;
      }
      if (!try_prior()) continue;  // seek to the predecessor
      return *this;                // done.
    }
  }
  return *this;  // LCOV_EXCL_LINE
}